

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavInitRequestApplyResult(void)

{
  ImVec2 *pIVar1;
  ImGuiID IVar2;
  ImGuiNavLayer IVar3;
  ImGuiWindow *pIVar4;
  long lVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *g;
  uint uVar8;
  ImGuiContext *pIVar9;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->NavWindow;
  if (pIVar4 != (ImGuiWindow *)0x0) {
    uVar8 = (GImGui->NavInitResult).ID;
    if (GImGui->NavId != uVar8) {
      IVar2 = (GImGui->NavInitResult).FocusScopeId;
      GImGui->NavJustMovedFromFocusScopeId = GImGui->NavFocusScopeId;
      pIVar7->NavJustMovedToId = uVar8;
      pIVar7->NavJustMovedToFocusScopeId = IVar2;
      pIVar7->NavJustMovedToKeyMods = 0;
      pIVar7->NavJustMovedToIsTabbing = false;
      pIVar7->NavJustMovedToHasSelectionData =
           (bool)((byte)((uint)(pIVar7->NavInitResult).InFlags >> 0x15) & 1);
    }
    pIVar9 = pIVar7;
    if ((pIVar7->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n",
               (ulong)uVar8,(ulong)pIVar7->NavLayer,pIVar4->Name);
      uVar8 = (pIVar7->NavInitResult).ID;
      pIVar9 = GImGui;
    }
    IVar3 = pIVar7->NavLayer;
    IVar2 = (pIVar7->NavInitResult).FocusScopeId;
    pIVar9->NavId = uVar8;
    pIVar9->NavLayer = IVar3;
    SetNavFocusScope(IVar2);
    pIVar4 = pIVar9->NavWindow;
    pIVar4->NavLastIds[IVar3] = uVar8;
    IVar6 = (pIVar7->NavInitResult).RectRel.Max;
    pIVar1 = &pIVar4->NavRectRel[IVar3].Min;
    *pIVar1 = (pIVar7->NavInitResult).RectRel.Min;
    pIVar1[1] = IVar6;
    pIVar9 = GImGui;
    pIVar1 = GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel + GImGui->NavLayer;
    pIVar1->x = 3.4028235e+38;
    pIVar1->y = 3.4028235e+38;
    pIVar7->NavIdIsAlive = true;
    lVar5 = (pIVar7->NavInitResult).SelectionUserData;
    if (lVar5 != -1) {
      pIVar7->NavLastValidSelectionUserData = lVar5;
    }
    if (pIVar7->NavInitRequestFromMove == true) {
      pIVar9->NavMousePosDirty = true;
      pIVar9->NavDisableHighlight = false;
      pIVar9->NavDisableMouseHover = true;
    }
  }
  return;
}

Assistant:

void ImGui::NavInitRequestApplyResult()
{
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    ImGuiContext& g = *GImGui;
    if (!g.NavWindow)
        return;

    ImGuiNavItemData* result = &g.NavInitResult;
    if (g.NavId != result->ID)
    {
        g.NavJustMovedFromFocusScopeId = g.NavFocusScopeId;
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = 0;
        g.NavJustMovedToIsTabbing = false;
        g.NavJustMovedToHasSelectionData = (result->InFlags & ImGuiItemFlags_HasSelectionUserData) != 0;
    }

    // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
    // FIXME-NAV: On _NavFlattened windows, g.NavWindow will only be updated during subsequent frame. Not a problem currently.
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);
    g.NavIdIsAlive = true; // Mark as alive from previous frame as we got a result
    if (result->SelectionUserData != ImGuiSelectionUserData_Invalid)
        g.NavLastValidSelectionUserData = result->SelectionUserData;
    if (g.NavInitRequestFromMove)
        NavRestoreHighlightAfterMove();
}